

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_list.c
# Opt level: O1

int cmime_list_new(CMimeList_T **list,_func_void_void_ptr *destroy)

{
  int iVar1;
  CMimeList_T *pCVar2;
  
  pCVar2 = (CMimeList_T *)calloc(1,0x20);
  *list = pCVar2;
  if (pCVar2 == (CMimeList_T *)0x0) {
    iVar1 = -1;
  }
  else {
    pCVar2->size = 0;
    pCVar2->head = (CMimeListElem_T *)0x0;
    pCVar2->tail = (CMimeListElem_T *)0x0;
    pCVar2->destroy = destroy;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int cmime_list_new(CMimeList_T **list, void (*destroy)(void *data)) {
    (*list) = (CMimeList_T *)calloc((size_t)1,sizeof(CMimeList_T));
    
    if(*list == NULL) {
        return(-1);
    }

    (*list)->size = 0;
    (*list)->head = NULL;
    (*list)->tail = NULL;
    (*list)->destroy = destroy;

    return(0);
}